

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_asub_s_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  pfVar2 = (env->active_fpu).fpr + wt;
  bVar19 = *(char *)pfVar1 - *(char *)pfVar2;
  bVar20 = *(char *)((long)pfVar1 + 1) - *(char *)((long)pfVar2 + 1);
  bVar21 = *(char *)((long)pfVar1 + 2) - *(char *)((long)pfVar2 + 2);
  bVar22 = *(char *)((long)pfVar1 + 3) - *(char *)((long)pfVar2 + 3);
  bVar23 = *(char *)((long)pfVar1 + 4) - *(char *)((long)pfVar2 + 4);
  bVar24 = *(char *)((long)pfVar1 + 5) - *(char *)((long)pfVar2 + 5);
  bVar25 = *(char *)((long)pfVar1 + 6) - *(char *)((long)pfVar2 + 6);
  bVar26 = *(char *)((long)pfVar1 + 7) - *(char *)((long)pfVar2 + 7);
  bVar27 = *(char *)((long)pfVar1 + 8) - *(char *)((long)pfVar2 + 8);
  bVar28 = *(char *)((long)pfVar1 + 9) - *(char *)((long)pfVar2 + 9);
  bVar29 = *(char *)((long)pfVar1 + 10) - *(char *)((long)pfVar2 + 10);
  bVar30 = *(char *)((long)pfVar1 + 0xb) - *(char *)((long)pfVar2 + 0xb);
  bVar31 = *(char *)((long)pfVar1 + 0xc) - *(char *)((long)pfVar2 + 0xc);
  bVar32 = *(char *)((long)pfVar1 + 0xd) - *(char *)((long)pfVar2 + 0xd);
  bVar33 = *(char *)((long)pfVar1 + 0xe) - *(char *)((long)pfVar2 + 0xe);
  bVar34 = *(char *)((long)pfVar1 + 0xf) - *(char *)((long)pfVar2 + 0xf);
  bVar3 = -bVar19;
  bVar4 = -bVar20;
  bVar5 = -bVar21;
  bVar6 = -bVar22;
  bVar7 = -bVar23;
  bVar8 = -bVar24;
  bVar9 = -bVar25;
  bVar10 = -bVar26;
  bVar11 = -bVar27;
  bVar12 = -bVar28;
  bVar13 = -bVar29;
  bVar14 = -bVar30;
  bVar15 = -bVar31;
  bVar16 = -bVar32;
  bVar17 = -bVar33;
  bVar18 = -bVar34;
  pfVar1 = (env->active_fpu).fpr + wd;
  *(byte *)pfVar1 = (bVar19 < bVar3) * bVar19 | (bVar19 >= bVar3) * bVar3;
  *(byte *)((long)pfVar1 + 1) = (bVar20 < bVar4) * bVar20 | (bVar20 >= bVar4) * bVar4;
  *(byte *)((long)pfVar1 + 2) = (bVar21 < bVar5) * bVar21 | (bVar21 >= bVar5) * bVar5;
  *(byte *)((long)pfVar1 + 3) = (bVar22 < bVar6) * bVar22 | (bVar22 >= bVar6) * bVar6;
  *(byte *)((long)pfVar1 + 4) = (bVar23 < bVar7) * bVar23 | (bVar23 >= bVar7) * bVar7;
  *(byte *)((long)pfVar1 + 5) = (bVar24 < bVar8) * bVar24 | (bVar24 >= bVar8) * bVar8;
  *(byte *)((long)pfVar1 + 6) = (bVar25 < bVar9) * bVar25 | (bVar25 >= bVar9) * bVar9;
  *(byte *)((long)pfVar1 + 7) = (bVar26 < bVar10) * bVar26 | (bVar26 >= bVar10) * bVar10;
  *(byte *)((long)pfVar1 + 8) = (bVar27 < bVar11) * bVar27 | (bVar27 >= bVar11) * bVar11;
  *(byte *)((long)pfVar1 + 9) = (bVar28 < bVar12) * bVar28 | (bVar28 >= bVar12) * bVar12;
  *(byte *)((long)pfVar1 + 10) = (bVar29 < bVar13) * bVar29 | (bVar29 >= bVar13) * bVar13;
  *(byte *)((long)pfVar1 + 0xb) = (bVar30 < bVar14) * bVar30 | (bVar30 >= bVar14) * bVar14;
  *(byte *)((long)pfVar1 + 0xc) = (bVar31 < bVar15) * bVar31 | (bVar31 >= bVar15) * bVar15;
  *(byte *)((long)pfVar1 + 0xd) = (bVar32 < bVar16) * bVar32 | (bVar32 >= bVar16) * bVar16;
  *(byte *)((long)pfVar1 + 0xe) = (bVar33 < bVar17) * bVar33 | (bVar33 >= bVar17) * bVar17;
  *(byte *)((long)pfVar1 + 0xf) = (bVar34 < bVar18) * bVar34 | (bVar34 >= bVar18) * bVar18;
  return;
}

Assistant:

void helper_msa_asub_s_b(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_asub_s_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_asub_s_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_asub_s_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_asub_s_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_asub_s_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_asub_s_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_asub_s_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_asub_s_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_asub_s_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_asub_s_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_asub_s_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_asub_s_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_asub_s_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_asub_s_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_asub_s_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_asub_s_df(DF_BYTE, pws->b[15], pwt->b[15]);
}